

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

void mriStep_Free(ARKodeMem ark_mem)

{
  void *pvVar1;
  sunindextype Clrw;
  sunindextype Cliw;
  long local_30;
  long local_28;
  
  if ((ark_mem != (ARKodeMem)0x0) && (pvVar1 = ark_mem->step_mem, pvVar1 != (void *)0x0)) {
    if (*(MRIStepCoupling *)((long)pvVar1 + 0x38) != (MRIStepCoupling)0x0) {
      MRIStepCoupling_Space(*(MRIStepCoupling *)((long)pvVar1 + 0x38),&local_28,&local_30);
      MRIStepCoupling_Free(*(MRIStepCoupling *)((long)pvVar1 + 0x38));
      *(undefined8 *)((long)pvVar1 + 0x38) = 0;
      ark_mem->liw = ark_mem->liw - local_28;
      ark_mem->lrw = ark_mem->lrw - local_30;
      if (*(void **)((long)pvVar1 + 0x60) != (void *)0x0) {
        free(*(void **)((long)pvVar1 + 0x60));
        *(undefined8 *)((long)pvVar1 + 0x60) = 0;
        ark_mem->liw = ark_mem->liw - (long)*(int *)((long)pvVar1 + 0x48);
      }
      if (*(void **)((long)pvVar1 + 0x58) != (void *)0x0) {
        free(*(void **)((long)pvVar1 + 0x58));
        *(undefined8 *)((long)pvVar1 + 0x58) = 0;
        ark_mem->liw = ark_mem->liw - (long)*(int *)((long)pvVar1 + 0x48);
      }
      if (*(void **)((long)pvVar1 + 0x68) != (void *)0x0) {
        free(*(void **)((long)pvVar1 + 0x68));
        *(undefined8 *)((long)pvVar1 + 0x68) = 0;
        ark_mem->lrw = ark_mem->lrw - (long)*(int *)((long)pvVar1 + 0x48);
      }
      if (*(void **)((long)pvVar1 + 0x70) != (void *)0x0) {
        free(*(void **)((long)pvVar1 + 0x70));
        *(undefined8 *)((long)pvVar1 + 0x70) = 0;
        ark_mem->lrw = ark_mem->lrw - (long)*(int *)((long)pvVar1 + 0x48);
      }
    }
    if ((*(long *)((long)pvVar1 + 0x98) != 0) && (*(int *)((long)pvVar1 + 0xa0) != 0)) {
      SUNNonlinSolFree();
      *(undefined4 *)((long)pvVar1 + 0xa0) = 0;
    }
    *(undefined8 *)((long)pvVar1 + 0x98) = 0;
    if (*(code **)((long)pvVar1 + 0x148) != (code *)0x0) {
      (**(code **)((long)pvVar1 + 0x148))(ark_mem);
      *(undefined8 *)((long)pvVar1 + 0x150) = 0;
    }
    if (*(long *)((long)pvVar1 + 0x78) != 0) {
      arkFreeVec(ark_mem,(N_Vector *)((long)pvVar1 + 0x78));
      *(N_Vector *)((long)pvVar1 + 0x78) = (N_Vector)0x0;
    }
    if (*(long *)((long)pvVar1 + 0x80) != 0) {
      arkFreeVec(ark_mem,(N_Vector *)((long)pvVar1 + 0x80));
      *(N_Vector *)((long)pvVar1 + 0x80) = (N_Vector)0x0;
    }
    if (*(long *)((long)pvVar1 + 0x88) != 0) {
      arkFreeVec(ark_mem,(N_Vector *)((long)pvVar1 + 0x88));
      *(N_Vector *)((long)pvVar1 + 0x88) = (N_Vector)0x0;
    }
    if (*(long *)((long)pvVar1 + 0x28) != 0) {
      arkFreeVecArray(*(int *)((long)pvVar1 + 0x50),(N_Vector **)((long)pvVar1 + 0x28),ark_mem->lrw1
                      ,&ark_mem->lrw,ark_mem->liw1,&ark_mem->liw);
    }
    if (*(long *)((long)pvVar1 + 0x30) != 0) {
      arkFreeVecArray(*(int *)((long)pvVar1 + 0x50),(N_Vector **)((long)pvVar1 + 0x30),ark_mem->lrw1
                      ,&ark_mem->lrw,ark_mem->liw1,&ark_mem->liw);
    }
    if (*(void **)((long)pvVar1 + 0x1a0) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 0x1a0));
      *(undefined8 *)((long)pvVar1 + 0x1a0) = 0;
      ark_mem->lrw = ark_mem->lrw - (long)*(int *)((long)pvVar1 + 0x198);
    }
    if (*(void **)((long)pvVar1 + 0x1a8) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 0x1a8));
      *(undefined8 *)((long)pvVar1 + 0x1a8) = 0;
      ark_mem->liw = ark_mem->liw - (long)*(int *)((long)pvVar1 + 0x198);
    }
    *(undefined4 *)((long)pvVar1 + 0x198) = 0;
    free(ark_mem->step_mem);
    ark_mem->step_mem = (void *)0x0;
  }
  return;
}

Assistant:

void mriStep_Free(ARKodeMem ark_mem)
{
  sunindextype Cliw, Clrw;
  ARKodeMRIStepMem step_mem;

  /* nothing to do if ark_mem is already NULL */
  if (ark_mem == NULL) { return; }

  /* conditional frees on non-NULL MRIStep module */
  if (ark_mem->step_mem != NULL)
  {
    step_mem = (ARKodeMRIStepMem)ark_mem->step_mem;

    /* free the coupling structure and derived quantities */
    if (step_mem->MRIC != NULL)
    {
      MRIStepCoupling_Space(step_mem->MRIC, &Cliw, &Clrw);
      MRIStepCoupling_Free(step_mem->MRIC);
      step_mem->MRIC = NULL;
      ark_mem->liw -= Cliw;
      ark_mem->lrw -= Clrw;
      if (step_mem->stagetypes)
      {
        free(step_mem->stagetypes);
        step_mem->stagetypes = NULL;
        ark_mem->liw -= step_mem->stages;
      }
      if (step_mem->stage_map)
      {
        free(step_mem->stage_map);
        step_mem->stage_map = NULL;
        ark_mem->liw -= step_mem->stages;
      }
      if (step_mem->Ae_row)
      {
        free(step_mem->Ae_row);
        step_mem->Ae_row = NULL;
        ark_mem->lrw -= step_mem->stages;
      }
      if (step_mem->Ai_row)
      {
        free(step_mem->Ai_row);
        step_mem->Ai_row = NULL;
        ark_mem->lrw -= step_mem->stages;
      }
    }

    /* free the nonlinear solver memory (if applicable) */
    if ((step_mem->NLS != NULL) && (step_mem->ownNLS))
    {
      SUNNonlinSolFree(step_mem->NLS);
      step_mem->ownNLS = SUNFALSE;
    }
    step_mem->NLS = NULL;

    /* free the linear solver memory */
    if (step_mem->lfree != NULL)
    {
      step_mem->lfree((void*)ark_mem);
      step_mem->lmem = NULL;
    }

    /* free the sdata, zpred and zcor vectors */
    if (step_mem->sdata != NULL)
    {
      arkFreeVec(ark_mem, &step_mem->sdata);
      step_mem->sdata = NULL;
    }
    if (step_mem->zpred != NULL)
    {
      arkFreeVec(ark_mem, &step_mem->zpred);
      step_mem->zpred = NULL;
    }
    if (step_mem->zcor != NULL)
    {
      arkFreeVec(ark_mem, &step_mem->zcor);
      step_mem->zcor = NULL;
    }

    /* free the RHS vectors */
    if (step_mem->Fse)
    {
      arkFreeVecArray(step_mem->nstages_allocated, &(step_mem->Fse),
                      ark_mem->lrw1, &(ark_mem->lrw), ark_mem->liw1,
                      &(ark_mem->liw));
    }

    if (step_mem->Fsi)
    {
      arkFreeVecArray(step_mem->nstages_allocated, &(step_mem->Fsi),
                      ark_mem->lrw1, &(ark_mem->lrw), ark_mem->liw1,
                      &(ark_mem->liw));
    }

    /* free the reusable arrays for fused vector interface */
    if (step_mem->cvals != NULL)
    {
      free(step_mem->cvals);
      step_mem->cvals = NULL;
      ark_mem->lrw -= (step_mem->nfusedopvecs);
    }
    if (step_mem->Xvecs != NULL)
    {
      free(step_mem->Xvecs);
      step_mem->Xvecs = NULL;
      ark_mem->liw -= (step_mem->nfusedopvecs);
    }
    step_mem->nfusedopvecs = 0;

    /* free the time stepper module itself */
    free(ark_mem->step_mem);
    ark_mem->step_mem = NULL;
  }
}